

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_565d99::BlockScopePushPop::BlockScopePushPop
          (BlockScopePushPop *this,cmMakefile *mf,ScopeSet *scopes)

{
  bool bVar1;
  unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
  local_40;
  unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
  local_38 [3];
  ScopeSet *local_20;
  ScopeSet *scopes_local;
  cmMakefile *mf_local;
  BlockScopePushPop *this_local;
  
  local_20 = scopes;
  scopes_local = (ScopeSet *)mf;
  mf_local = (cmMakefile *)this;
  std::unique_ptr<cmMakefile::PolicyPushPop,std::default_delete<cmMakefile::PolicyPushPop>>::
  unique_ptr<std::default_delete<cmMakefile::PolicyPushPop>,void>
            ((unique_ptr<cmMakefile::PolicyPushPop,std::default_delete<cmMakefile::PolicyPushPop>> *
             )this);
  std::unique_ptr<cmMakefile::VariablePushPop,std::default_delete<cmMakefile::VariablePushPop>>::
  unique_ptr<std::default_delete<cmMakefile::VariablePushPop>,void>
            ((unique_ptr<cmMakefile::VariablePushPop,std::default_delete<cmMakefile::VariablePushPop>>
              *)&this->VariableScope);
  bVar1 = ::cm::enum_set<(anonymous_namespace)::ScopeType,_0>::contains(local_20,POLICIES);
  if (bVar1) {
    std::make_unique<cmMakefile::PolicyPushPop,cmMakefile*&>((cmMakefile **)local_38);
    std::unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>::
    operator=(&this->PolicyScope,local_38);
    std::unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>::
    ~unique_ptr(local_38);
  }
  bVar1 = ::cm::enum_set<(anonymous_namespace)::ScopeType,_0>::contains(local_20,VARIABLES);
  if (bVar1) {
    std::make_unique<cmMakefile::VariablePushPop,cmMakefile*&>((cmMakefile **)&local_40);
    std::unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
    ::operator=(&this->VariableScope,&local_40);
    std::unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
    ::~unique_ptr(&local_40);
  }
  return;
}

Assistant:

BlockScopePushPop::BlockScopePushPop(cmMakefile* mf, const ScopeSet& scopes)
{
  if (scopes.contains(ScopeType::POLICIES)) {
    this->PolicyScope = cm::make_unique<cmMakefile::PolicyPushPop>(mf);
  }
  if (scopes.contains(ScopeType::VARIABLES)) {
    this->VariableScope = cm::make_unique<cmMakefile::VariablePushPop>(mf);
  }
}